

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects.cpp
# Opt level: O2

void rainbowCycle(int SpeedDelay)

{
  uint uVar1;
  int ledIndex;
  short sVar2;
  
  for (sVar2 = 0; sVar2 != 0x500; sVar2 = sVar2 + 1) {
    uVar1 = 0;
    for (ledIndex = 0; ledIndex != 0x18; ledIndex = ledIndex + 1) {
      Wheel((char)((uVar1 & 0xffff) / 0x18) + (char)sVar2);
      setPixel(ledIndex,Wheel::c[0],Wheel::c[1],Wheel::c[2]);
      uVar1 = uVar1 + 0x100;
    }
    showStrip();
    delay(SpeedDelay);
  }
  return;
}

Assistant:

void rainbowCycle(int SpeedDelay) {
    byte *c;
    uint16_t i, j;

    for(j=0; j<256*5; j++) { // 5 cycles of all colors on wheel
        for(i=0; i< NUM_LEDS; i++) {
            c=Wheel(((i * 256 / NUM_LEDS) + j) & 255);
            setPixel(i, *c, *(c+1), *(c+2));
        }
        showStrip();
        delay(SpeedDelay);
    }
}